

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
* OpenMD::operator&&(AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                     *__return_storage_ptr__,
                    ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *cons1,
                    ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *cons2)

{
  LessThanOrEqualToConstraint<double> local_60;
  GreaterThanConstraint<double> local_38;
  
  GreaterThanConstraint<double>::GreaterThanConstraint
            (&local_38,(GreaterThanConstraint<double> *)cons1);
  LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
            (&local_60,(LessThanOrEqualToConstraint<double> *)cons2);
  AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
  ::AndParamConstraint(__return_storage_ptr__,&local_38,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline AndParamConstraint<Cons1T, Cons2T> operator&&(
      const ParamConstraintFacade<Cons1T>& cons1,
      const ParamConstraintFacade<Cons2T>& cons2) {
    return AndParamConstraint<Cons1T, Cons2T>(
        *static_cast<const Cons1T*>(&cons1),
        *static_cast<const Cons2T*>(&cons2));
  }